

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O2

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (len != (size_t *)0x0) {
    *len = 0;
    pbVar3 = *sigp;
    uVar4 = 0;
    if (pbVar3 < sigend) {
      pbVar1 = pbVar3 + 1;
      *sigp = pbVar1;
      bVar2 = *pbVar3;
      if ((ulong)bVar2 != 0xff) {
        if ((char)bVar2 < '\0') {
          if (bVar2 != 0x80) {
            uVar6 = bVar2 & 0x7f;
            if ((((ulong)uVar6 <= (ulong)((long)sigend - (long)pbVar1)) && ((byte)uVar6 < 9)) &&
               (*pbVar1 != 0)) {
              uVar7 = 0;
              for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
                uVar7 = uVar7 << 8 | (ulong)pbVar1[uVar5];
                *len = uVar7;
                *sigp = pbVar3 + uVar5 + 2;
              }
              uVar4 = 0;
              if (uVar7 <= ((long)sigend - (long)pbVar1) - uVar5) {
                uVar4 = (uint)(0x7f < uVar7);
              }
            }
          }
        }
        else {
          *len = (ulong)bVar2;
          uVar4 = 1;
        }
      }
    }
    return uVar4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecdsa_impl.h"
          ,0x27,"test condition failed: len != NULL");
  abort();
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * it is certainly longer than the passed array size. */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array.
           (Checking this is the responsibility of the caller but it
           can't hurt do it here, too.) */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}